

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_211f4e::SStringViewArchive::SStringViewArchive(SStringViewArchive *this)

{
  shared_ptr<pstore::file::in_memory> *file;
  SStringViewArchive *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SStringViewArchive_003d46c8;
  in_memory_store::in_memory_store(&this->store_);
  file = in_memory_store::file(&this->store_);
  pstore::database::database<pstore::file::in_memory>(&this->db_,file,true);
  pstore::database::set_vacuum_mode(&this->db_,disabled);
  return;
}

Assistant:

SStringViewArchive ()
                : db_{store_.file ()} {
            db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        }